

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.h
# Opt level: O0

uint __thiscall
Corrade::Utility::ConfigurationGroup::value<unsigned_int>
          (ConfigurationGroup *this,string *key,uint index,ConfigurationValueFlags flags)

{
  bool bVar1;
  uint local_80;
  BasicStringView<const_char> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  UnderlyingType local_32;
  UnderlyingType local_31;
  string *local_30;
  string *value;
  string *psStack_20;
  uint index_local;
  string *key_local;
  ConfigurationGroup *this_local;
  ConfigurationValueFlags flags_local;
  
  local_31 = flags._value;
  value._4_4_ = index;
  psStack_20 = key;
  key_local = (string *)this;
  this_local._3_1_ = flags._value;
  local_30 = valueInternal(this,key,index,flags);
  bVar1 = local_30 == (string *)0x0;
  if (bVar1) {
    Containers::BasicStringView<const_char>::BasicStringView(&local_68);
    Containers::BasicStringView::operator_cast_to_string(&local_58,(BasicStringView *)&local_68);
    local_80 = Implementation::IntegerConfigurationValue<unsigned_int>::fromString
                         (&local_58,this_local._3_1_);
  }
  else {
    local_32 = this_local._3_1_;
    local_80 = Implementation::IntegerConfigurationValue<unsigned_int>::fromString
                         (local_30,this_local._3_1_);
  }
  this_local._4_4_ = local_80;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  return this_local._4_4_;
}

Assistant:

inline T ConfigurationGroup::value(const std::string& key, const unsigned int index, const ConfigurationValueFlags flags) const {
    const std::string* value = valueInternal(key, index, flags);
    /* If the value is not found, it's important to *not* call fromString()
       with an empty std::string -- if T is a view, it would cause it to
       reference that temporary std::string, which is SSO'd on the stack. That
       wouldn't be a problem per-se given the view is empty, but with
       StringView a conversion from an empty std::string marks it as
       NullTerminated, and that's a problem because the stack location gets
       overwritten and the view pointing to it won't be null-terminated
       anymore. Asserting in the better case, causing some rogue memory access
       in the worse scenario.

       Instead, pass it a StringView -- the fromString() implementation is
       likely using it already anyway and so it'll properly not reference
       anything temporary, and if the implementation doesn't use StringView,
       it'll get implicitly converted to a temporary std::string instance. */
    /** @todo clean up once Configuration is STL-free */
    return value ?
        ConfigurationValue<T>::fromString(*value, flags) :
        ConfigurationValue<T>::fromString(Containers::StringView{}, flags);
}